

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O2

void __thiscall
pele::physics::pltfilemanager::PltFileManager::PltFileManager
          (PltFileManager *this,string *a_pltFile)

{
  string pltFileHeader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)this,(string *)a_pltFile);
  this->m_nvars = 0;
  (this->m_vars).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vars).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_vars).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_vars).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->m_time = 0.0;
  (this->m_grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_refRatio).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->m_refRatio).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->m_refRatio).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->m_dmaps).
  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dmaps).
  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dmaps).
  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&local_50,&this->m_pltFile,"/Header");
  readGenericPlotfileHeader(this,&local_50);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::resize
            (&(this->m_dmaps).
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,
             (long)this->m_nlevels);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::resize
            (&(this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,
             (long)this->m_nlevels);
  readPlotFile(this);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

PltFileManager::PltFileManager(std::string a_pltFile)
  : m_pltFile{std::move(a_pltFile)}
{
  // Get the plt metadata and resize part of the data vectors
  std::string pltFileHeader(m_pltFile + "/Header");
  readGenericPlotfileHeader(pltFileHeader);

  // Resize the actual data container
  m_dmaps.resize(m_nlevels);
  m_data.resize(m_nlevels);

  // Read the pltfile data
  readPlotFile();
}